

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtabletmanager.cpp
# Opt level: O1

void __thiscall QEvdevTabletManager::removeDevice(QEvdevTabletManager *this,QString *deviceNode)

{
  int iVar1;
  QLoggingCategory *pQVar2;
  undefined8 uVar3;
  long lVar4;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::remove
                    (&this->m_activeDevices,(char *)deviceNode);
  if ((char)iVar1 != '\0') {
    pQVar2 = QtPrivateLogging::qLcEvdevTablet();
    if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_28 = pQVar2->name;
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      uVar3 = QString::utf16();
      QMessageLogger::debug(local_40,"Removing device at %ls",uVar3);
    }
    lVar4 = QGuiApplicationPrivate::inputDeviceManager();
    QInputDeviceManagerPrivate::setDeviceCount((DeviceType)*(undefined8 *)(lVar4 + 8),4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTabletManager::removeDevice(const QString &deviceNode)
{
    if (m_activeDevices.remove(deviceNode)) {
        qCDebug(qLcEvdevTablet, "Removing device at %ls", qUtf16Printable(deviceNode));
        updateDeviceCount();
    }
}